

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

double * r8mat_copy_new(int m,int n,double *a1)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  int local_28;
  int local_24;
  int j;
  int i;
  double *a2;
  double *a1_local;
  int n_local;
  int m_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(m * n);
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
    for (local_24 = 0; local_24 < m; local_24 = local_24 + 1) {
      pdVar3[local_24 + local_28 * m] = a1[local_24 + local_28 * m];
    }
  }
  return pdVar3;
}

Assistant:

double *r8mat_copy_new ( int m, int n, double a1[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8MAT_COPY_NEW copies one R8MAT to a "new" R8MAT.
//
//  Discussion:
//
//    An R8MAT is a doubly dimensioned array of R8's, which
//    may be stored as a vector in column-major order.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 July 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns.
//
//    Input, double A1[M*N], the matrix to be copied.
//
//    Output, double R8MAT_COPY_NEW[M*N], the copy of A1.
//
{
  double *a2;
  int i;
  int j;

  a2 = new double[m*n];

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < m; i++ )
    {
      a2[i+j*m] = a1[i+j*m];
    }
  }
  return a2;
}